

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

Symbol * sym_AddMacro(char *symName,int32_t defLineNo,char *body,size_t size)

{
  Symbol *pSVar1;
  FileStackNode *pFVar2;
  
  pSVar1 = createNonrelocSymbol(symName,false);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = (Symbol *)0x0;
  }
  else {
    pSVar1->type = SYM_MACRO;
    (pSVar1->field_8).field_2.macroSize = size;
    (pSVar1->field_8).field_2.macro = body;
    pFVar2 = fstk_GetFileStack();
    pSVar1->src = pFVar2;
    if (pFVar2 != (FileStackNode *)0x0) {
      lexer_GetLineNo();
    }
    pSVar1->fileLine = defLineNo;
  }
  return pSVar1;
}

Assistant:

struct Symbol *sym_AddMacro(char const *symName, int32_t defLineNo, char *body, size_t size)
{
	struct Symbol *sym = createNonrelocSymbol(symName, false);

	if (!sym)
		return NULL;

	sym->type = SYM_MACRO;
	sym->macroSize = size;
	sym->macro = body;
	setSymbolFilename(sym); // TODO: is this really necessary?
	// The symbol is created at the line after the `endm`,
	// override this with the actual definition line
	sym->fileLine = defLineNo;

	return sym;
}